

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

void wirehair::ShuffleDeck16(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t rv_1;
  uint32_t jj_1;
  uint32_t ii_1;
  uint32_t rv;
  uint32_t jj;
  uint32_t ii;
  uint32_t count_local;
  uint16_t *deck_local;
  PCGRandom *prng_local;
  uint32_t rot_1;
  uint32_t xorshifted_1;
  uint64_t oldstate_1;
  uint32_t rot;
  uint32_t xorshifted;
  uint64_t oldstate;
  
  *deck = 0;
  if (count < 0x101) {
    ii = 1;
    do {
      uVar1 = prng->State;
      prng->State = uVar1 * 0x5851f42d4c957f2d + prng->Inc;
      uVar2 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
      rot._0_1_ = (byte)(uVar1 >> 0x3b);
      uVar2 = uVar2 >> (byte)rot | uVar2 << 0x20 - (byte)rot;
      switch(count - ii) {
      case 0:
        return;
      case 3:
        uVar3 = (uVar2 & 0xff) % ii;
        deck[ii] = deck[uVar3];
        deck[uVar3] = (uint16_t)ii;
        ii = ii + 1;
      case 2:
        uVar3 = (uVar2 >> 8 & 0xff) % ii;
        deck[ii] = deck[uVar3];
        deck[uVar3] = (uint16_t)ii;
        ii = ii + 1;
      case 1:
        uVar2 = (uVar2 >> 0x10 & 0xff) % ii;
        deck[ii] = deck[uVar2];
        deck[uVar2] = (uint16_t)ii;
        return;
      default:
        uVar3 = (uVar2 & 0xff) % ii;
        deck[ii] = deck[uVar3];
        deck[uVar3] = (uint16_t)ii;
        uVar3 = ii + 1;
        uVar4 = (uVar2 >> 8 & 0xff) % uVar3;
        deck[uVar3] = deck[uVar4];
        deck[uVar4] = (uint16_t)uVar3;
        uVar3 = ii + 2;
        uVar4 = (uVar2 >> 0x10 & 0xff) % uVar3;
        deck[uVar3] = deck[uVar4];
        deck[uVar4] = (uint16_t)uVar3;
        uVar3 = ii + 3;
        uVar2 = (uVar2 >> 0x18) % uVar3;
        deck[uVar3] = deck[uVar2];
        deck[uVar2] = (uint16_t)uVar3;
        ii = ii + 4;
      }
    } while( true );
  }
  ii_1 = 1;
  while( true ) {
    uVar1 = prng->State;
    prng->State = uVar1 * 0x5851f42d4c957f2d + prng->Inc;
    uVar2 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
    rot_1._0_1_ = (byte)(uVar1 >> 0x3b);
    uVar2 = uVar2 >> (byte)rot_1 | uVar2 << 0x20 - (byte)rot_1;
    if (count == ii_1) {
      return;
    }
    if (count - ii_1 == 1) break;
    uVar3 = (uVar2 & 0xffff) % ii_1;
    deck[ii_1] = deck[uVar3];
    deck[uVar3] = (uint16_t)ii_1;
    uVar3 = ii_1 + 1;
    uVar2 = (uVar2 >> 0x10) % uVar3;
    deck[uVar3] = deck[uVar2];
    deck[uVar2] = (uint16_t)uVar3;
    ii_1 = ii_1 + 2;
  }
  uVar2 = (uVar2 & 0xffff) % ii_1;
  deck[ii_1] = deck[uVar2];
  deck[uVar2] = (uint16_t)ii_1;
  return;
}

Assistant:

void ShuffleDeck16(
    PCGRandom &prng,
    uint16_t * GF256_RESTRICT deck,
    const uint32_t count)
{
    deck[0] = 0;

    // If we can unroll 4 times:
    if (count <= 256)
    {
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 8-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 24) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 3:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 2:
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 1:
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
    else
    {
        // For each deck entry:
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 16-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint16_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 1:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
}